

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall Instance::type_abi_cxx11_(string *__return_storage_ptr__,Instance *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_type);
  return __return_storage_ptr__;
}

Assistant:

std::string Instance::type() const {
    return _type;
}